

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::DoSimplePolygons(Clipper *this)

{
  char cVar1;
  long lVar2;
  OutRec *OldOutRec;
  OutPt *pOVar3;
  OutRec *InnerOutRec;
  bool bVar4;
  bool bVar5;
  OutPt *pOVar6;
  OutRec *outrec;
  ulong uVar7;
  OutPt *pOVar8;
  OutPt **ppOVar9;
  OutPt *pOVar10;
  
  uVar7 = 0;
  do {
    do {
      lVar2 = *(long *)((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]);
      if ((ulong)(*(long *)(this->_vptr_Clipper[-3] +
                           (long)&(this->m_Maxima).
                                  super__List_base<long_long,_std::allocator<long_long>_>) - lVar2
                 >> 3) <= uVar7) {
        return;
      }
      OldOutRec = *(OutRec **)(lVar2 + uVar7 * 8);
      uVar7 = uVar7 + 1;
      pOVar6 = OldOutRec->Pts;
    } while ((pOVar6 == (OutPt *)0x0) || (pOVar8 = pOVar6, OldOutRec->IsOpen != false));
    do {
      ppOVar9 = &pOVar8->Next;
      while (pOVar10 = *ppOVar9, pOVar10 != pOVar6) {
        if (((((pOVar8->Pt).X == (pOVar10->Pt).X) && ((pOVar8->Pt).Y == (pOVar10->Pt).Y)) &&
            (pOVar10->Next != pOVar8)) && (pOVar6 = pOVar10->Prev, pOVar6 != pOVar8)) {
          pOVar3 = pOVar8->Prev;
          pOVar8->Prev = pOVar6;
          pOVar6->Next = pOVar8;
          pOVar10->Prev = pOVar3;
          pOVar3->Next = pOVar10;
          OldOutRec->Pts = pOVar8;
          outrec = ClipperBase::CreateOutRec
                             ((ClipperBase *)
                              ((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]));
          outrec->Pts = pOVar10;
          UpdateOutPtIdxs(outrec);
          pOVar6 = outrec->Pts;
          pOVar3 = OldOutRec->Pts;
          bVar4 = Poly2ContainsPoly1(pOVar6,pOVar3);
          pOVar10 = pOVar8;
          if (bVar4) {
            outrec->IsHole = (bool)(OldOutRec->IsHole ^ 1);
            outrec->FirstLeft = OldOutRec;
            cVar1 = this->m_UsingPolyTree;
            InnerOutRec = outrec;
            outrec = OldOutRec;
          }
          else {
            bVar5 = Poly2ContainsPoly1(pOVar3,pOVar6);
            bVar4 = OldOutRec->IsHole;
            outrec->IsHole = bVar4;
            if (!bVar5) {
              outrec->FirstLeft = OldOutRec->FirstLeft;
              if (this->m_UsingPolyTree == true) {
                FixupFirstLefts1(this,OldOutRec,outrec);
              }
              goto LAB_00115f20;
            }
            OldOutRec->IsHole = (bool)(bVar4 ^ 1);
            outrec->FirstLeft = OldOutRec->FirstLeft;
            OldOutRec->FirstLeft = outrec;
            cVar1 = this->m_UsingPolyTree;
            InnerOutRec = OldOutRec;
          }
          if (cVar1 == '\x01') {
            FixupFirstLefts2(this,InnerOutRec,outrec);
          }
        }
LAB_00115f20:
        pOVar6 = OldOutRec->Pts;
        ppOVar9 = &pOVar10->Next;
      }
      pOVar8 = pOVar8->Next;
    } while (pOVar8 != pOVar6);
  } while( true );
}

Assistant:

void Clipper::DoSimplePolygons()
{
  PolyOutList::size_type i = 0;
  while (i < m_PolyOuts.size()) 
  {
    OutRec* outrec = m_PolyOuts[i++];
    OutPt* op = outrec->Pts;
    if (!op || outrec->IsOpen) continue;
    do //for each Pt in Polygon until duplicate found do ...
    {
      OutPt* op2 = op->Next;
      while (op2 != outrec->Pts) 
      {
        if ((op->Pt == op2->Pt) && op2->Next != op && op2->Prev != op) 
        {
          //split the polygon into two ...
          OutPt* op3 = op->Prev;
          OutPt* op4 = op2->Prev;
          op->Prev = op4;
          op4->Next = op;
          op2->Prev = op3;
          op3->Next = op2;

          outrec->Pts = op;
          OutRec* outrec2 = CreateOutRec();
          outrec2->Pts = op2;
          UpdateOutPtIdxs(*outrec2);
          if (Poly2ContainsPoly1(outrec2->Pts, outrec->Pts))
          {
            //OutRec2 is contained by OutRec1 ...
            outrec2->IsHole = !outrec->IsHole;
            outrec2->FirstLeft = outrec;
            if (m_UsingPolyTree) FixupFirstLefts2(outrec2, outrec);
          }
          else
            if (Poly2ContainsPoly1(outrec->Pts, outrec2->Pts))
          {
            //OutRec1 is contained by OutRec2 ...
            outrec2->IsHole = outrec->IsHole;
            outrec->IsHole = !outrec2->IsHole;
            outrec2->FirstLeft = outrec->FirstLeft;
            outrec->FirstLeft = outrec2;
            if (m_UsingPolyTree) FixupFirstLefts2(outrec, outrec2);
            }
            else
          {
            //the 2 polygons are separate ...
            outrec2->IsHole = outrec->IsHole;
            outrec2->FirstLeft = outrec->FirstLeft;
            if (m_UsingPolyTree) FixupFirstLefts1(outrec, outrec2);
            }
          op2 = op; //ie get ready for the Next iteration
        }
        op2 = op2->Next;
      }
      op = op->Next;
    }
    while (op != outrec->Pts);
  }
}